

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcInse.c
# Opt level: O3

void Gia_ManInseInit(Gia_Man_t *p,Vec_Int_t *vInit)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  undefined8 *puVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  
  iVar1 = p->nRegs;
  if (0 < (long)iVar1) {
    pVVar5 = p->vCos;
    iVar2 = pVVar5->nSize;
    lVar7 = 0;
    do {
      uVar8 = (iVar2 - iVar1) + (int)lVar7;
      if (((int)uVar8 < 0) || (iVar2 <= (int)uVar8)) {
LAB_005a013e:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar3 = pVVar5->pArray[uVar8];
      if ((iVar3 < 0) || (p->nObjs <= iVar3)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      if (vInit->nSize <= lVar7) goto LAB_005a013e;
      iVar4 = p->iData;
      lVar9 = (long)iVar4;
      puVar6 = (undefined8 *)((long)(iVar3 * iVar4 * 2) * 8 + (long)p->pData);
      if (vInit->pArray[lVar7] == 0) {
        if (0 < iVar4) {
          lVar10 = 0;
          do {
            puVar6[lVar10] = 0xffffffffffffffff;
            puVar6[lVar9 + lVar10] = 0;
            lVar10 = lVar10 + 1;
          } while (lVar9 != lVar10);
        }
      }
      else if (vInit->pArray[lVar7] == 1) {
        if (0 < iVar4) {
          lVar10 = 0;
          do {
            puVar6[lVar10] = 0;
            puVar6[lVar9 + lVar10] = 0xffffffffffffffff;
            lVar10 = lVar10 + 1;
          } while (lVar9 != lVar10);
        }
      }
      else {
        lVar10 = lVar9;
        if (0 < iVar4) {
          do {
            puVar6[lVar9] = 0;
            *puVar6 = 0;
            puVar6 = puVar6 + 1;
            lVar10 = lVar10 + -1;
          } while (lVar10 != 0);
        }
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar1);
  }
  return;
}

Assistant:

void Gia_ManInseInit( Gia_Man_t * p, Vec_Int_t * vInit )
{
    Gia_Obj_t * pObj;
    word * pData1, * pData0;
    int i, k;
    Gia_ManForEachRi( p, pObj, k )
    {
        pData0 = Gia_ParTestObj( p, Gia_ObjId(p, pObj) );
        pData1 = pData0 + p->iData;
        if ( Vec_IntEntry(vInit, k) == 0 ) // 0
            for ( i = 0; i < p->iData; i++ )
                pData0[i] = ~(word)0, pData1[i] = 0;
        else if ( Vec_IntEntry(vInit, k) == 1 ) // 1
            for ( i = 0; i < p->iData; i++ )
                pData0[i] = 0, pData1[i] = ~(word)0;
        else // if ( Vec_IntEntry(vInit, k) > 1 ) // X
            for ( i = 0; i < p->iData; i++ )
                pData0[i] = pData1[i] = 0;
    }
}